

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseUtils.h
# Opt level: O0

void __thiscall Minisat::StreamBuffer::assureLookahead(StreamBuffer *this)

{
  size_t sVar1;
  undefined8 *in_RDI;
  
  if (*(int *)((long)in_RDI + 0x10000c) <= *(int *)(in_RDI + 0x20001)) {
    *(undefined4 *)(in_RDI + 0x20001) = 0;
    sVar1 = fread(in_RDI + 1,1,0x100000,(FILE *)*in_RDI);
    *(int *)((long)in_RDI + 0x10000c) = (int)sVar1;
  }
  return;
}

Assistant:

void assureLookahead()
    {
        if (pos >= size) {
            pos = 0;
#ifdef USE_LIBZ
            size = gzread(in, buf, sizeof(buf));
#else
            size = fread(buf, sizeof(unsigned char), sizeof(buf), in);
#endif
        }
    }